

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listReporters(Config *param_1)

{
  int iVar1;
  IRegistryHub *pIVar2;
  undefined4 extraout_var;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  TextAttributes local_b8;
  string local_a0;
  Text wrapper;
  
  std::operator<<((ostream *)&std::cout,"Available reporters:\n");
  pIVar2 = getRegistryHub();
  iVar1 = (*pIVar2->_vptr_IRegistryHub[2])(pIVar2);
  lVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x18))
                    ((long *)CONCAT44(extraout_var,iVar1));
  p_Var7 = (_Base_ptr)0x0;
  p_Var6 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
  for (p_Var4 = p_Var6; p_Var4 != (_Rb_tree_node_base *)(lVar3 + 8);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (p_Var7 <= p_Var4[1]._M_parent) {
      p_Var7 = p_Var4[1]._M_parent;
    }
  }
  for (; p_Var6 != (_Rb_tree_node_base *)(lVar3 + 8);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    (**(code **)(**(long **)(p_Var6 + 2) + 0x28))(&local_a0);
    local_b8.initialIndent = 0;
    local_b8.indent = (size_t)&p_Var7->field_0x7;
    local_b8.width = 0x48 - (long)p_Var7;
    Tbc::Text::Text(&wrapper,&local_a0,&local_b8);
    std::__cxx11::string::~string((string *)&local_a0);
    poVar5 = std::operator<<((ostream *)&std::cout,"  ");
    poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
    poVar5 = std::operator<<(poVar5,':');
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_a0,((char)p_Var7 + '\x02') - (char)p_Var6[1]._M_parent);
    poVar5 = std::operator<<(poVar5,(string *)&local_a0);
    poVar5 = Tbc::operator<<(poVar5,&wrapper);
    std::operator<<(poVar5,'\n');
    std::__cxx11::string::~string((string *)&local_a0);
    Tbc::Text::~Text(&wrapper);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return *(size_t *)(lVar3 + 0x28);
}

Assistant:

inline std::size_t listReporters( Config const& /*config*/ ) {
        Catch::cout() << "Available reporters:\n";
        IReporterRegistry::FactoryMap const& factories = getRegistryHub().getReporterRegistry().getFactories();
        IReporterRegistry::FactoryMap::const_iterator itBegin = factories.begin(), itEnd = factories.end(), it;
        std::size_t maxNameLen = 0;
        for(it = itBegin; it != itEnd; ++it )
            maxNameLen = (std::max)( maxNameLen, it->first.size() );

        for(it = itBegin; it != itEnd; ++it ) {
            Text wrapper( it->second->getDescription(), TextAttributes()
                                                        .setInitialIndent( 0 )
                                                        .setIndent( 7+maxNameLen )
                                                        .setWidth( CATCH_CONFIG_CONSOLE_WIDTH - maxNameLen-8 ) );
            Catch::cout() << "  "
                    << it->first
                    << ':'
                    << std::string( maxNameLen - it->first.size() + 2, ' ' )
                    << wrapper << '\n';
        }
        Catch::cout() << std::endl;
        return factories.size();
    }